

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

bool __thiscall
Js::ScriptContext::IsInNewFunctionMap
          (ScriptContext *this,EvalMapString *key,FunctionInfo **ppFuncInfo)

{
  Cache *pCVar1;
  Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  **ppCVar2;
  Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
  *pCVar3;
  bool success;
  FunctionInfo **ppFuncInfo_local;
  EvalMapString *key_local;
  ScriptContext *this_local;
  
  pCVar1 = Cache(this);
  ppCVar2 = Memory::WriteBarrierPtr::operator_cast_to_Cache__
                      ((WriteBarrierPtr *)&pCVar1->newFunctionCache);
  if (*ppCVar2 ==
      (Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
       *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pCVar1 = Cache(this);
    pCVar3 = Memory::
             WriteBarrierPtr<JsUtil::Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>_>
             ::operator->(&pCVar1->newFunctionCache);
    this_local._7_1_ =
         JsUtil::
         Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
         ::TryGetValue(pCVar3,key,ppFuncInfo);
    if (this_local._7_1_) {
      pCVar1 = Cache(this);
      pCVar3 = Memory::
               WriteBarrierPtr<JsUtil::Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>_>
               ::operator->(&pCVar1->newFunctionCache);
      JsUtil::
      Cache<Js::EvalMapStringInternal<false>,_Js::FunctionInfo_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry>
      ::NotifyAdd(pCVar3,key);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ScriptContext::IsInNewFunctionMap(EvalMapString const& key, FunctionInfo **ppFuncInfo)
    {
        if (this->Cache()->newFunctionCache == nullptr)
        {
            return false;
        }

        // If eval map cleanup is false, to preserve existing behavior, add it to the eval map MRU list
        bool success = this->Cache()->newFunctionCache->TryGetValue(key, ppFuncInfo);
        if (success)
        {
            this->Cache()->newFunctionCache->NotifyAdd(key);
#ifdef VERBOSE_EVAL_MAP
#if DBG
            this->Cache()->newFunctionCache->DumpKeepAlives();
#endif
#endif
        }

        return success;
    }